

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleTabBar::child(QAccessibleTabBar *this,int index)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  QAccessibleTabButton *this_00;
  QTabBar *pQVar5;
  QObject *pQVar6;
  long in_FS_OFFSET;
  uint local_30;
  int index_local;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  index_local = index;
  uVar2 = QHash<int,_unsigned_int>::value(&this->m_childInterfaces,&index_local);
  iVar4 = index_local;
  if (uVar2 != 0) {
    this_00 = (QAccessibleTabButton *)QAccessible::accessibleInterface(uVar2);
    goto LAB_004cb15d;
  }
  pQVar5 = tabBar(this);
  iVar3 = QTabBar::count(pQVar5);
  iVar1 = index_local;
  if (iVar4 < iVar3) {
    this_00 = (QAccessibleTabButton *)operator_new(0x28);
    pQVar5 = tabBar(this);
    QAccessibleTabButton::QAccessibleTabButton(this_00,pQVar5,index_local);
    QAccessible::registerAccessibleInterface((QAccessibleInterface *)this_00);
    local_30 = QAccessible::uniqueId((QAccessibleInterface *)this_00);
    QHash<int,unsigned_int>::emplace<unsigned_int_const&>
              ((QHash<int,unsigned_int> *)&this->m_childInterfaces,&index_local,&local_30);
    goto LAB_004cb15d;
  }
  pQVar5 = tabBar(this);
  iVar3 = QTabBar::count(pQVar5);
  iVar4 = index_local;
  if (iVar1 < iVar3) {
LAB_004cb15a:
    this_00 = (QAccessibleTabButton *)0x0;
  }
  else {
    pQVar5 = tabBar(this);
    iVar3 = QTabBar::count(pQVar5);
    iVar1 = index_local;
    if (iVar4 == iVar3) {
      pQVar5 = tabBar(this);
      pQVar6 = *(QObject **)(*(long *)&(pQVar5->super_QWidget).field_0x8 + 0x290);
    }
    else {
      pQVar5 = tabBar(this);
      iVar4 = QTabBar::count(pQVar5);
      if (iVar1 - iVar4 != 1) goto LAB_004cb15a;
      pQVar5 = tabBar(this);
      pQVar6 = *(QObject **)(*(long *)&(pQVar5->super_QWidget).field_0x8 + 0x288);
    }
    this_00 = (QAccessibleTabButton *)QAccessible::queryAccessibleInterface(pQVar6);
  }
LAB_004cb15d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return &this_00->super_QAccessibleInterface;
}

Assistant:

QAccessibleInterface* QAccessibleTabBar::child(int index) const
{
    if (QAccessible::Id id = m_childInterfaces.value(index))
        return QAccessible::accessibleInterface(id);

    // first the tabs, then 2 buttons
    if (index < tabBar()->count()) {
        QAccessibleTabButton *button = new QAccessibleTabButton(tabBar(), index);
        QAccessible::registerAccessibleInterface(button);
        m_childInterfaces.insert(index, QAccessible::uniqueId(button));
        return button;
    } else if (index >= tabBar()->count()) {
        // left button
        if (index - tabBar()->count() == 0) {
            return QAccessible::queryAccessibleInterface(tabBar()->d_func()->leftB);
        }
        // right button
        if (index - tabBar()->count() == 1) {
            return QAccessible::queryAccessibleInterface(tabBar()->d_func()->rightB);
        }
    }
    return nullptr;
}